

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

IVec4 __thiscall tcu::getTextureFormatMantissaBitDepth(tcu *this,TextureFormat *format)

{
  int i;
  Channel CVar1;
  TextureSwizzle *pTVar2;
  undefined4 *puVar3;
  int i_3;
  Channel CVar4;
  long lVar5;
  Channel CVar6;
  Vector<int,_4> *res;
  Channel CVar7;
  undefined4 *puVar8;
  Channel CVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  uint uVar12;
  IVec4 IVar13;
  BVec4 chnMask;
  IVec4 chnBits;
  bool local_4c [4];
  undefined8 local_48;
  ulong uStack_40;
  undefined4 local_38 [6];
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  switch(format->type) {
  case SNORM_INT8:
  case SNORM_INT16:
  case SNORM_INT32:
  case UNORM_INT8:
  case UNORM_INT16:
  case UNORM_INT24:
  case UNORM_INT32:
  case UNORM_BYTE_44:
  case UNORM_SHORT_565:
  case UNORM_SHORT_555:
  case UNORM_SHORT_4444:
  case UNORM_SHORT_5551:
  case UNORM_SHORT_1555:
  case UNORM_INT_101010:
  case SNORM_INT_1010102_REV:
  case UNORM_INT_1010102_REV:
  case UNSIGNED_BYTE_44:
  case UNSIGNED_SHORT_565:
  case UNSIGNED_SHORT_4444:
  case UNSIGNED_SHORT_5551:
  case SIGNED_INT_1010102_REV:
  case UNSIGNED_INT_1010102_REV:
  case UNSIGNED_INT_999_E5_REV:
  case UNSIGNED_INT_16_8_8:
  case UNSIGNED_INT_24_8:
  case UNSIGNED_INT_24_8_REV:
  case SIGNED_INT8:
  case SIGNED_INT16:
  case SIGNED_INT32:
  case UNSIGNED_INT8:
  case UNSIGNED_INT16:
  case UNSIGNED_INT24:
  case UNSIGNED_INT32:
    getChannelBitDepth(format->type);
    break;
  case UNSIGNED_INT_11F_11F_10F_REV:
    uVar10 = 6;
    uVar11 = 6;
    uVar12 = 5;
    goto LAB_00161989;
  case HALF_FLOAT:
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&local_48 + lVar5 * 4) = 10;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    break;
  case FLOAT:
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&local_48 + lVar5 * 4) = 0x17;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    break;
  case FLOAT64:
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&local_48 + lVar5 * 4) = 0x34;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    break;
  case FLOAT_UNSIGNED_INT_24_8_REV:
    uVar10 = 0x17;
    uVar11 = 8;
    uVar12 = 0;
LAB_00161989:
    local_48 = CONCAT44(uVar11,uVar10);
    uStack_40 = (ulong)uVar12;
    break;
  default:
    local_48 = 0;
    uStack_40 = 0;
  }
  pTVar2 = getChannelReadSwizzle(format->order);
  CVar6 = pTVar2->components[0];
  CVar7 = pTVar2->components[1];
  lVar5 = 0;
  CVar9 = pTVar2->components[2];
  CVar1 = pTVar2->components[3];
  local_4c[0] = CVar6 < CHANNEL_ZERO;
  CVar4 = CHANNEL_0;
  if (CVar6 >= CHANNEL_ZERO) {
    CVar6 = CVar4;
  }
  local_4c[1] = CVar7 < CHANNEL_ZERO;
  if (CVar7 >= CHANNEL_ZERO) {
    CVar7 = CVar4;
  }
  local_4c[2] = CVar9 < CHANNEL_ZERO;
  if (CVar9 >= CHANNEL_ZERO) {
    CVar9 = CVar4;
  }
  local_4c[3] = CVar1 < CHANNEL_ZERO;
  if (CVar1 >= CHANNEL_ZERO) {
    CVar1 = CVar4;
  }
  puVar3 = &local_20;
  local_20 = *(undefined4 *)((long)&local_48 + (long)(int)CVar6 * 4);
  local_1c = *(undefined4 *)((long)&local_48 + (long)(int)CVar7 * 4);
  local_18 = *(undefined4 *)((long)&local_48 + (long)(int)CVar9 * 4);
  local_14 = *(undefined4 *)((long)&local_48 + (long)(int)CVar1 * 4);
  IVar13.m_data._8_8_ = local_38;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  do {
    puVar8 = IVar13.m_data._8_8_;
    if (local_4c[lVar5] != false) {
      puVar8 = puVar3;
    }
    *(undefined4 *)(this + lVar5 * 4) = *puVar8;
    lVar5 = lVar5 + 1;
    IVar13.m_data._8_8_ = IVar13.m_data._8_8_ + 1;
    puVar3 = puVar3 + 1;
  } while (lVar5 != 4);
  IVar13.m_data._0_8_ = this;
  return (IVec4)IVar13.m_data;
}

Assistant:

IVec4 getTextureFormatMantissaBitDepth (const TextureFormat& format)
{
	const IVec4						chnBits		= getChannelMantissaBitDepth(format.type);
	const TextureSwizzle::Channel*	map			= getChannelReadSwizzle(format.order).components;
	const BVec4						chnMask		= BVec4(deInRange32(map[0], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[1], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[2], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[3], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE);
	const IVec4						chnSwz		= IVec4((chnMask[0]) ? ((int)map[0]) : (0),
														(chnMask[1]) ? ((int)map[1]) : (0),
														(chnMask[2]) ? ((int)map[2]) : (0),
														(chnMask[3]) ? ((int)map[3]) : (0));

	return select(chnBits.swizzle(chnSwz.x(), chnSwz.y(), chnSwz.z(), chnSwz.w()), IVec4(0), chnMask);
}